

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IGeneratorInfo * __thiscall
Catch::GeneratorsForTest::getGeneratorInfo(GeneratorsForTest *this,string *fileInfo,size_t size)

{
  bool bVar1;
  IGeneratorInfo *pIVar2;
  pointer ppVar3;
  undefined1 uVar4;
  long in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_IGeneratorInfo_*>_>::value,_pair<iterator,_bool>_>
  _Var5;
  IGeneratorInfo *info;
  const_iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*>_>_>
  *in_stack_ffffffffffffff38;
  GeneratorInfo *in_stack_ffffffffffffff40;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*>
  *__x;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*>
  local_80;
  IGeneratorInfo *local_48;
  iterator local_40;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*>_>
  local_38;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*>_>
  local_28 [4];
  IGeneratorInfo *local_8;
  
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*>_>_>
       ::find(in_stack_ffffffffffffff38,(key_type *)0x1a88cd);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*>_>
  ::_Rb_tree_const_iterator(local_28,&local_30);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*>_>_>
       ::end(in_stack_ffffffffffffff38);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*>_>
  ::_Rb_tree_const_iterator(&local_38,&local_40);
  bVar1 = std::operator==(local_28,&local_38);
  if (bVar1) {
    pIVar2 = (IGeneratorInfo *)operator_new(0x18);
    GeneratorInfo::GeneratorInfo(in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
    __x = &local_80;
    local_48 = pIVar2;
    std::make_pair<std::__cxx11::string_const&,Catch::IGeneratorInfo*&>
              (&__x->first,(IGeneratorInfo **)(in_RDI + 8));
    _Var5 = std::
            map<std::__cxx11::string,Catch::IGeneratorInfo*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::IGeneratorInfo*>>>
            ::insert<std::pair<std::__cxx11::string,Catch::IGeneratorInfo*>>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),__x);
    uVar4 = _Var5.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*>
             *)0x1a89c7);
    std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>::push_back
              ((vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_> *)
               CONCAT17(uVar4,in_stack_ffffffffffffff50),(value_type *)__x);
    local_8 = local_48;
  }
  else {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*>_>
                           *)0x1a8a35);
    local_8 = ppVar3->second;
  }
  return local_8;
}

Assistant:

IGeneratorInfo& getGeneratorInfo( std::string const& fileInfo, std::size_t size ) {
            std::map<std::string, IGeneratorInfo*>::const_iterator it = m_generatorsByName.find( fileInfo );
            if( it == m_generatorsByName.end() ) {
                IGeneratorInfo* info = new GeneratorInfo( size );
                m_generatorsByName.insert( std::make_pair( fileInfo, info ) );
                m_generatorsInOrder.push_back( info );
                return *info;
            }
            return *it->second;
        }